

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeT2LDRDPreInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  void *Decoder_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint RegNo;
  uint RegNo_00;
  uint RegNo_01;
  DecodeStatus DVar2;
  void *pvVar3;
  
  RegNo_00 = Insn >> 0xc & 0xf;
  RegNo_01 = Insn >> 8 & 0xf;
  RegNo = Insn >> 0x10 & 0xf;
  Decoder_00 = (void *)(ulong)((uint)(RegNo != RegNo_01) * 2 | 1);
  if (RegNo == RegNo_00) {
    Decoder_00 = (void *)0x1;
  }
  pvVar3 = (void *)0x3;
  if ((Insn & 0x1200000) != 0x1000000) {
    pvVar3 = Decoder_00;
  }
  DVar2 = (DecodeStatus)pvVar3;
  if (RegNo_00 == RegNo_01) {
    DVar2 = MCDisassembler_SoftFail;
  }
  DVar1 = DecoderGPRRegisterClass(Inst,RegNo_00,Address,Decoder_00);
  if ((DVar1 == MCDisassembler_Success) ||
     (DVar2 = MCDisassembler_SoftFail, DVar1 == MCDisassembler_SoftFail)) {
    DVar1 = DecoderGPRRegisterClass(Inst,RegNo_01,Address_00,Decoder_00);
    if (DVar1 != MCDisassembler_Success) {
      if (DVar1 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar2 = MCDisassembler_SoftFail;
    }
    DVar1 = DecoderGPRRegisterClass(Inst,RegNo,Address_01,Decoder_00);
    if (DVar1 != MCDisassembler_Success) {
      if (DVar1 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar2 = MCDisassembler_SoftFail;
    }
    DVar1 = DecodeT2AddrModeImm8s4
                      (Inst,RegNo << 9 | Insn >> 0xf & 0x100 | Insn & 0xff,Address_02,Decoder_00);
    if (DVar1 == MCDisassembler_Fail) {
      return MCDisassembler_Fail;
    }
    if (DVar1 == MCDisassembler_Success) {
      return DVar2;
    }
    if (DVar1 == MCDisassembler_SoftFail) {
      return MCDisassembler_SoftFail;
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeT2LDRDPreInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rt2 = fieldFromInstruction_4(Insn, 8, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned addr = fieldFromInstruction_4(Insn, 0, 8);
	unsigned W = fieldFromInstruction_4(Insn, 21, 1);
	unsigned U = fieldFromInstruction_4(Insn, 23, 1);
	unsigned P = fieldFromInstruction_4(Insn, 24, 1);
	bool writeback = (W == 1) | (P == 0);

	addr |= (U << 8) | (Rn << 9);

	if (writeback && (Rn == Rt || Rn == Rt2))
		Check(&S, MCDisassembler_SoftFail);
	if (Rt == Rt2)
		Check(&S, MCDisassembler_SoftFail);

	// Rt
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	// Rt2
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt2, Address, Decoder)))
		return MCDisassembler_Fail;
	// Writeback operand
	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	// addr
	if (!Check(&S, DecodeT2AddrModeImm8s4(Inst, addr, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}